

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

size_t __thiscall
kj::ArrayInputStream::tryRead(ArrayInputStream *this,void *dst,size_t minBytes,size_t maxBytes)

{
  size_t *psVar1;
  ulong __n;
  
  __n = (this->array).size_;
  if (maxBytes <= __n) {
    __n = maxBytes;
  }
  memcpy(dst,(this->array).ptr,__n);
  (this->array).ptr = (this->array).ptr + __n;
  psVar1 = &(this->array).size_;
  *psVar1 = *psVar1 - __n;
  return __n;
}

Assistant:

size_t ArrayInputStream::tryRead(void* dst, size_t minBytes, size_t maxBytes) {
  size_t n = std::min(maxBytes, array.size());
  memcpy(dst, array.begin(), n);
  array = array.slice(n, array.size());
  return n;
}